

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ldi_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,int32_t s10)

{
  fpr_t *pfVar1;
  long lVar2;
  float32 fVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 auVar4 [16];
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x118b,"void helper_msa_ldi_df_mips(CPUMIPSState *, uint32_t, uint32_t, int32_t)"
                 );
  }
  pfVar1 = (env->active_fpu).fpr + wd;
  switch(df) {
  case 0:
    uVar7 = (undefined1)((uint)s10 >> 0x18);
    uVar6 = (undefined1)((uint)s10 >> 0x10);
    uVar5 = (undefined1)((uint)s10 >> 8);
    auVar4[0] = (undefined1)s10;
    auVar4[1] = auVar4[0];
    auVar4._2_6_ = (int6)(CONCAT53(CONCAT41((int)(CONCAT35(CONCAT21(CONCAT11(uVar7,uVar7),uVar6),
                                                           CONCAT14(uVar6,s10)) >> 0x20),uVar5),
                                   CONCAT12(uVar5,(short)s10)) >> 0x10);
    auVar4._8_8_ = 0;
    auVar4 = pshuflw(auVar4,auVar4,0);
    fVar3 = auVar4._0_4_;
    pfVar1->fs[0] = fVar3;
    *(float32 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = fVar3;
    *(float32 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = fVar3;
    *(float32 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = fVar3;
    return;
  case 1:
    lVar2 = 0;
    do {
      *(short *)((long)pfVar1 + lVar2 * 2) = (short)s10;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    break;
  case 2:
    lVar2 = 0;
    do {
      pfVar1->fs[lVar2] = s10;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    break;
  case 3:
    lVar2 = 0;
    do {
      *(long *)(pfVar1->fs + lVar2 * 2) = (long)s10;
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  return;
}

Assistant:

void helper_msa_ldi_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                       int32_t s10)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    uint32_t i;

    switch (df) {
    case DF_BYTE:
        for (i = 0; i < DF_ELEMENTS(DF_BYTE); i++) {
            pwd->b[i] = (int8_t)s10;
        }
        break;
    case DF_HALF:
        for (i = 0; i < DF_ELEMENTS(DF_HALF); i++) {
            pwd->h[i] = (int16_t)s10;
        }
        break;
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            pwd->w[i] = (int32_t)s10;
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            pwd->d[i] = (int64_t)s10;
        }
       break;
    default:
        assert(0);
    }
}